

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::logAndSetTestResult
          (UploadWaitDrawCase *this)

{
  TestContext *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  char *pcVar7;
  string local_bb8;
  string local_b98;
  allocator<char> local_b71;
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  LogNumber<long> local_b00;
  MessageBuilder local_a90;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  LogNumber<long> local_898;
  MessageBuilder local_828;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  LogNumber<long> local_630;
  MessageBuilder local_5c0;
  MessageBuilder local_440;
  MessageBuilder local_2c0;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  ScopedLogSection local_f0;
  ScopedLogSection section_2;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  bool temporallyStable;
  int readStabilization;
  int renderStabilization;
  int renderReadStabilization;
  int uploadStabilization;
  UploadWaitDrawCase *this_local;
  
  _renderReadStabilization = this;
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Samples",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Result samples",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar5,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  logSamples(this);
  tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Stabilization",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Sample stability",(allocator<char> *)((long)&section_2.m_log + 7))
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar5,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  readStabilization = findStabilizationSample(this,0x18,"Combined draw and read");
  renderStabilization = findStabilizationSample(this,0,"Upload time");
  iVar3 = findStabilizationSample(this,8,"Draw call time");
  iVar4 = findStabilizationSample(this,0x10,"ReadPixels time");
  section.m_log._7_1_ = 1;
  bVar2 = checkSampleTemporalStability(this,0x18,"Combined draw and read");
  section.m_log._7_1_ = bVar2 & section.m_log._7_1_;
  bVar2 = checkSampleTemporalStability(this,0,"Upload time");
  section.m_log._7_1_ = bVar2 & section.m_log._7_1_;
  bVar2 = checkSampleTemporalStability(this,8,"Draw call time");
  section.m_log._7_1_ = bVar2 & section.m_log._7_1_;
  bVar2 = checkSampleTemporalStability(this,0x10,"ReadPixels time");
  section.m_log._7_1_ = bVar2 & section.m_log._7_1_;
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Results",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Results",&local_139);
  tcu::ScopedLogSection::ScopedLogSection(&local_f0,pTVar5,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  if (renderStabilization != 0) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_2c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_2c0,
                        (char (*) [71])
                        "Warning! Upload times are not stable, test result may not be accurate.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2c0);
  }
  if ((section.m_log._7_1_ & 1) == 0) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_440,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_440,
                        (char (*) [126])
                        "Warning! Time samples do not seem to be temporally stable, sample times seem to drift to one direction during test execution."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_440);
  }
  if (readStabilization == -1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_5c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_5c0,
                        (char (*) [66])
                        "Combined time used in draw call and ReadPixels did not stabilize.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5c0);
  }
  else {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_650,"RenderReadStabilizationPoint",&local_651);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_678,"Combined draw call and ReadPixels call time stabilization time"
               ,&local_679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"frames",&local_6a1);
    tcu::LogNumber<long>::LogNumber
              (&local_630,&local_650,&local_678,&local_6a0,QP_KEY_TAG_TIME,(long)readStabilization);
    tcu::TestLog::operator<<(pTVar5,&local_630);
    tcu::LogNumber<long>::~LogNumber(&local_630);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator(&local_6a1);
    std::__cxx11::string::~string((string *)&local_678);
    std::allocator<char>::~allocator(&local_679);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator(&local_651);
  }
  if (iVar3 == -1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_828,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_828,(char (*) [42])"Time used in draw call did not stabilize.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_828);
  }
  else {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b8,"DrawCallStabilizationPoint",&local_8b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8e0,"Draw call time stabilization time",&local_8e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"frames",&local_909);
    tcu::LogNumber<long>::LogNumber
              (&local_898,&local_8b8,&local_8e0,&local_908,QP_KEY_TAG_TIME,(long)iVar3);
    tcu::TestLog::operator<<(pTVar5,&local_898);
    tcu::LogNumber<long>::~LogNumber(&local_898);
    std::__cxx11::string::~string((string *)&local_908);
    std::allocator<char>::~allocator(&local_909);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::allocator<char>::~allocator(&local_8e1);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::allocator<char>::~allocator(&local_8b9);
  }
  if (iVar4 == -1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_a90,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_a90,(char (*) [43])"Time used in ReadPixels did not stabilize.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a90);
  }
  else {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b20,"ReadPixelsStabilizationPoint",&local_b21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b48,"ReadPixels call time stabilization time",&local_b49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b70,"frames",&local_b71);
    tcu::LogNumber<long>::LogNumber
              (&local_b00,&local_b20,&local_b48,&local_b70,QP_KEY_TAG_TIME,(long)iVar4);
    tcu::TestLog::operator<<(pTVar5,&local_b00);
    tcu::LogNumber<long>::~LogNumber(&local_b00);
    std::__cxx11::string::~string((string *)&local_b70);
    std::allocator<char>::~allocator(&local_b71);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator(&local_b49);
    std::__cxx11::string::~string((string *)&local_b20);
    std::allocator<char>::~allocator(&local_b21);
  }
  if (readStabilization == -1) {
    pTVar1 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx;
    de::toString<int>(&local_bb8,&this->m_numMaxSwaps);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar7);
    std::__cxx11::string::~string((string *)&local_bb8);
  }
  else {
    pTVar1 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx;
    de::toString<int>(&local_b98,&readStabilization);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar7);
    std::__cxx11::string::~string((string *)&local_b98);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_f0);
  return;
}

Assistant:

void UploadWaitDrawCase::logAndSetTestResult (void)
{
	int		uploadStabilization;
	int		renderReadStabilization;
	int		renderStabilization;
	int		readStabilization;
	bool	temporallyStable;

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Samples", "Result samples");
		logSamples();
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Stabilization", "Sample stability");

		// log stabilization points
		renderReadStabilization	= findStabilizationSample(&Result::renderReadDuration, "Combined draw and read");
		uploadStabilization		= findStabilizationSample(&Result::uploadDuration, "Upload time");
		renderStabilization		= findStabilizationSample(&Result::renderDuration, "Draw call time");
		readStabilization		= findStabilizationSample(&Result::readDuration, "ReadPixels time");

		temporallyStable		= true;
		temporallyStable		&= checkSampleTemporalStability(&Result::renderReadDuration, "Combined draw and read");
		temporallyStable		&= checkSampleTemporalStability(&Result::uploadDuration, "Upload time");
		temporallyStable		&= checkSampleTemporalStability(&Result::renderDuration, "Draw call time");
		temporallyStable		&= checkSampleTemporalStability(&Result::readDuration, "ReadPixels time");
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Results", "Results");

		// Check result sanily
		if (uploadStabilization != 0)
			m_testCtx.getLog() << tcu::TestLog::Message << "Warning! Upload times are not stable, test result may not be accurate." << tcu::TestLog::EndMessage;
		if (!temporallyStable)
			m_testCtx.getLog() << tcu::TestLog::Message << "Warning! Time samples do not seem to be temporally stable, sample times seem to drift to one direction during test execution." << tcu::TestLog::EndMessage;

		// render & read
		if (renderReadStabilization == -1)
			m_testCtx.getLog() << tcu::TestLog::Message << "Combined time used in draw call and ReadPixels did not stabilize." << tcu::TestLog::EndMessage;
		else
			m_testCtx.getLog() << tcu::TestLog::Integer("RenderReadStabilizationPoint", "Combined draw call and ReadPixels call time stabilization time", "frames", QP_KEY_TAG_TIME, renderReadStabilization);

		// draw call
		if (renderStabilization == -1)
			m_testCtx.getLog() << tcu::TestLog::Message << "Time used in draw call did not stabilize." << tcu::TestLog::EndMessage;
		else
			m_testCtx.getLog() << tcu::TestLog::Integer("DrawCallStabilizationPoint", "Draw call time stabilization time", "frames", QP_KEY_TAG_TIME, renderStabilization);

		// readpixels
		if (readStabilization == -1)
			m_testCtx.getLog() << tcu::TestLog::Message << "Time used in ReadPixels did not stabilize." << tcu::TestLog::EndMessage;
		else
			m_testCtx.getLog() << tcu::TestLog::Integer("ReadPixelsStabilizationPoint", "ReadPixels call time stabilization time", "frames", QP_KEY_TAG_TIME, readStabilization);

		// Report renderReadStabilization
		if (renderReadStabilization != -1)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(renderReadStabilization).c_str());
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(m_numMaxSwaps).c_str()); // don't report -1
	}
}